

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  Byte *pBVar1;
  uint8_t *data;
  ssize_t bytes_avail;
  zip *zip;
  archive_read *a;
  void *p_local;
  
  zip = *p;
  bytes_avail = **(ssize_t **)((zip->ppmd8).See[3] + 0x14);
  data = (uint8_t *)0x0;
  a = (archive_read *)p;
  pBVar1 = (Byte *)__archive_read_ahead((archive_read *)zip,1,(ssize_t *)&data);
  if ((long)data < 1) {
    *(undefined1 *)(bytes_avail + 0x1ec9) = 1;
    p_local._7_1_ = '\0';
  }
  else {
    __archive_read_consume((archive_read *)zip,1);
    *(long *)(bytes_avail + 0x1e0) = *(long *)(bytes_avail + 0x1e0) + 1;
    p_local._7_1_ = *pBVar1;
  }
  return p_local._7_1_;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    (size_t)zip->ppstream.stream_in+1, &bytes_avail);
		if(data == NULL || bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}